

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplexTimer.h
# Opt level: O3

bool __thiscall
SimplexTimer::reportSimplexClockList
          (SimplexTimer *this,char *grepStamp,vector<int,_std::allocator<int>_> *simplex_clock_list,
          HighsTimerClock *simplex_timer_clock,double tolerance_percent_report_)

{
  HighsTimer *this_00;
  int *piVar1;
  pointer piVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  vector<int,_std::allocator<int>_> clockList;
  vector<int,_std::allocator<int>_> local_58;
  undefined1 local_38 [16];
  
  local_38._8_4_ = in_XMM0_Dc;
  local_38._0_8_ = tolerance_percent_report_;
  local_38._12_4_ = in_XMM0_Dd;
  this_00 = simplex_timer_clock->timer_pointer_;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar5 = (uint)((ulong)((long)(simplex_clock_list->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(simplex_clock_list->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  std::vector<int,_std::allocator<int>_>::resize(&local_58,(long)(int)uVar5);
  piVar1 = (simplex_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)uVar5) {
    piVar2 = (simplex_clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4] = piVar1[piVar2[uVar4]];
      uVar4 = uVar4 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar4);
  }
  bVar3 = HighsTimer::reportOnTolerance
                    (this_00,grepStamp,&local_58,
                     (this_00->clock_time).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[*piVar1],
                     (double)(~-(ulong)(0.0 <= (double)local_38._0_8_) & 0x3e45798ee2308c3a |
                             local_38._0_8_ & -(ulong)(0.0 <= (double)local_38._0_8_)));
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool reportSimplexClockList(const char* grepStamp,
                              const std::vector<HighsInt> simplex_clock_list,
                              const HighsTimerClock& simplex_timer_clock,
                              const double tolerance_percent_report_ = -1) {
    HighsTimer* timer_pointer = simplex_timer_clock.timer_pointer_;
    const std::vector<HighsInt>& clock = simplex_timer_clock.clock_;
    HighsInt simplex_clock_list_size = simplex_clock_list.size();
    std::vector<HighsInt> clockList;
    clockList.resize(simplex_clock_list_size);
    for (HighsInt en = 0; en < simplex_clock_list_size; en++) {
      clockList[en] = clock[simplex_clock_list[en]];
    }
    const double ideal_sum_time =
        timer_pointer->clock_time[clock[SimplexTotalClock]];
    const double tolerance_percent_report =
        tolerance_percent_report_ >= 0 ? tolerance_percent_report_ : 1e-8;
    return timer_pointer->reportOnTolerance(
        grepStamp, clockList, ideal_sum_time, tolerance_percent_report);
  }